

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMalformedImages.cpp
# Opt level: O2

void anon_unknown.dwarf_1971c5::readImage(char *inFileName)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  Header *pHVar4;
  int *piVar5;
  long sizeY;
  allocator<char> local_a9;
  AcesInputFile in;
  Array2D<Imf_3_4::Rgba> p;
  undefined8 local_78 [4];
  Header h;
  
  p._sizeX = 0;
  p._sizeY = 0;
  p._data = (Rgba *)0x0;
  local_78[0] = 0;
  Imf_3_4::Header::Header(&h,0x40,0x40,1.0,(Vec2 *)local_78,1.0,INCREASING_Y,ZIP_COMPRESSION);
  poVar3 = std::operator<<((ostream *)&std::cout,"Reading file ");
  poVar3 = std::operator<<(poVar3,inFileName);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,inFileName,&local_a9);
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::AcesInputFile::AcesInputFile(&in,(string *)local_78,iVar2);
  std::__cxx11::string::~string((string *)local_78);
  pHVar4 = (Header *)Imf_3_4::AcesInputFile::header();
  Imf_3_4::Header::operator=(&h,pHVar4);
  piVar5 = (int *)Imf_3_4::Header::dataWindow();
  iVar2 = *piVar5;
  iVar1 = piVar5[1];
  sizeY = ((long)piVar5[2] - (long)iVar2) + 1;
  Imf_3_4::Array2D<Imf_3_4::Rgba>::resizeErase(&p,(long)((piVar5[3] - iVar1) + 1),sizeY);
  Imf_3_4::AcesInputFile::setFrameBuffer
            ((Rgba *)&in,(ulong)(p._data + (-(long)iVar2 - (long)((int)sizeY * iVar1))),1);
  Imf_3_4::AcesInputFile::readPixels((int)&in,iVar1);
  Imf_3_4::AcesInputFile::~AcesInputFile(&in);
  Imf_3_4::Header::~Header(&h);
  Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D(&p);
  return;
}

Assistant:

void
readImage (const char inFileName[])
{
    Array2D<Rgba> p;
    Header        h;
    Box2i         dw;
    int           width;
    int           height;

    {
        cout << "Reading file " << inFileName << endl;

        AcesInputFile in (inFileName);

        h  = in.header ();
        dw = h.dataWindow ();

        width  = dw.max.x - dw.min.x + 1;
        height = dw.max.y - dw.min.y + 1;
        p.resizeErase (height, width);

        in.setFrameBuffer (&p[0][0] - dw.min.x - dw.min.y * width, 1, width);
        in.readPixels (dw.min.y, dw.max.y);
    }
}